

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.h
# Opt level: O0

string * __thiscall
google::protobuf::compiler::cpp::IncludeGuard_abi_cxx11_
          (string *__return_storage_ptr__,cpp *this,FileDescriptor *file,bool pb_h,Options *options)

{
  bool bVar1;
  string *__lhs;
  undefined7 in_register_00000009;
  char *__rhs;
  Options *extraout_RDX;
  byte local_bd;
  string local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined1 local_48 [8];
  string filename_identifier;
  Options *options_local;
  bool pb_h_local;
  FileDescriptor *file_local;
  
  filename_identifier.field_2._8_8_ = CONCAT71(in_register_00000009,pb_h);
  __lhs = FileDescriptor::name_abi_cxx11_((FileDescriptor *)this);
  local_bd = 0;
  if (((ulong)file & 1) != 0) {
    local_bd = *(byte *)(filename_identifier.field_2._8_8_ + 0x21);
  }
  __rhs = "";
  if ((local_bd & 1) != 0) {
    __rhs = ".pb.h";
  }
  std::operator+(&local_68,__lhs,__rhs);
  FilenameIdentifier((string *)local_48,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  bVar1 = IsWellKnownMessage((FileDescriptor *)this);
  if (bVar1) {
    MacroPrefix_abi_cxx11_(&local_b8,(cpp *)filename_identifier.field_2._8_8_,extraout_RDX);
    std::operator+(&local_98,&local_b8,"_INCLUDED_");
    std::operator+(__return_storage_ptr__,&local_98,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_b8);
  }
  else {
    std::operator+(__return_storage_ptr__,"GOOGLE_PROTOBUF_INCLUDED_",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
  }
  std::__cxx11::string::~string((string *)local_48);
  return __return_storage_ptr__;
}

Assistant:

inline std::string IncludeGuard(const FileDescriptor* file, bool pb_h,
                                const Options& options) {
  // If we are generating a .pb.h file and the proto_h option is enabled, then
  // the .pb.h gets an extra suffix.
  std::string filename_identifier = FilenameIdentifier(
      file->name() + (pb_h && options.proto_h ? ".pb.h" : ""));

  if (IsWellKnownMessage(file)) {
    // For well-known messages we need third_party/protobuf and net/proto2 to
    // have distinct include guards, because some source files include both and
    // both need to be defined (the third_party copies will be in the
    // google::protobuf_opensource namespace).
    return MacroPrefix(options) + "_INCLUDED_" + filename_identifier;
  } else {
    // Ideally this case would use distinct include guards for opensource and
    // google3 protos also.  (The behavior of "first #included wins" is not
    // ideal).  But unfortunately some legacy code includes both and depends on
    // the identical include guards to avoid compile errors.
    //
    // We should clean this up so that this case can be removed.
    return "GOOGLE_PROTOBUF_INCLUDED_" + filename_identifier;
  }
}